

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O0

EStatusCode __thiscall
AbstractContentContext::DrawImage
          (AbstractContentContext *this,double inX,double inY,string *inImagePath,
          ImageOptions *inOptions)

{
  int iVar1;
  EStatusCode EVar2;
  double *pdVar3;
  undefined4 extraout_var;
  ObjectIDTypeAndBool OVar4;
  double local_f8;
  double local_f0;
  string local_d0;
  unsigned_long local_b0;
  undefined1 local_a8;
  unsigned_long local_a0;
  ObjectIDTypeAndBool result;
  double scaleY;
  double scaleX;
  DoubleAndDoublePair imageDimensions;
  double dStack_68;
  int i;
  double transformation [6];
  ImageOptions *inOptions_local;
  string *inImagePath_local;
  double inY_local;
  double inX_local;
  AbstractContentContext *this_local;
  
  memset(&stack0xffffffffffffff98,0,0x30);
  dStack_68 = 1.0;
  transformation[2] = 1.0;
  if (inOptions->transformationMethod == eMatrix) {
    for (imageDimensions.second._4_4_ = 0; imageDimensions.second._4_4_ < 6;
        imageDimensions.second._4_4_ = imageDimensions.second._4_4_ + 1) {
      transformation[(long)imageDimensions.second._4_4_ + -1] =
           inOptions->matrix[imageDimensions.second._4_4_];
    }
  }
  else if (inOptions->transformationMethod == eFit) {
    _scaleX = PDFHummus::DocumentContext::GetImageDimensions
                        (this->mDocumentContext,inImagePath,inOptions->imageIndex,
                         &inOptions->pdfParsingOptions);
    scaleY = 1.0;
    result.second = false;
    result._9_7_ = 0x3ff00000000000;
    if (inOptions->fitPolicy == eAlways) {
      scaleY = inOptions->boundingBoxWidth / scaleX;
      result._8_8_ = inOptions->boundingBoxHeight / imageDimensions.first;
    }
    else if ((inOptions->boundingBoxWidth <= scaleX && scaleX != inOptions->boundingBoxWidth) ||
            (inOptions->boundingBoxHeight <= imageDimensions.first &&
             imageDimensions.first != inOptions->boundingBoxHeight)) {
      if (scaleX < inOptions->boundingBoxWidth || scaleX == inOptions->boundingBoxWidth) {
        local_f0 = 1.0;
      }
      else {
        local_f0 = inOptions->boundingBoxWidth / scaleX;
      }
      scaleY = local_f0;
      if (imageDimensions.first < inOptions->boundingBoxHeight ||
          imageDimensions.first == inOptions->boundingBoxHeight) {
        local_f8 = 1.0;
      }
      else {
        local_f8 = inOptions->boundingBoxHeight / imageDimensions.first;
      }
      result._8_8_ = local_f8;
    }
    if ((inOptions->fitProportional & 1U) != 0) {
      pdVar3 = std::min<double>(&scaleY,(double *)&result.second);
      result._8_8_ = *pdVar3;
      scaleY = (double)result._8_8_;
    }
    dStack_68 = scaleY;
    transformation[2] = (double)result._8_8_;
  }
  transformation[3] = transformation[3] + inX;
  transformation[4] = transformation[4] + inY;
  OVar4 = PDFHummus::DocumentContext::RegisterImageForDrawing
                    (this->mDocumentContext,inImagePath,inOptions->imageIndex);
  local_b0 = OVar4.first;
  local_a8 = OVar4.second;
  local_a0 = local_b0;
  result.first._0_1_ = local_a8;
  if (((undefined1  [16])OVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    (*this->_vptr_AbstractContentContext[3])
              (this,inImagePath,inOptions->imageIndex,local_b0,&inOptions->pdfParsingOptions);
  }
  q(this);
  cm(this,dStack_68,transformation[0],transformation[1],transformation[2],transformation[3],
     transformation[4]);
  iVar1 = (*this->_vptr_AbstractContentContext[2])();
  ResourcesDictionary::AddFormXObjectMapping_abi_cxx11_
            (&local_d0,(ResourcesDictionary *)CONCAT44(extraout_var,iVar1),local_a0);
  Do(this,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  Q(this);
  EVar2 = GetCurrentStatusCode(this);
  return EVar2;
}

Assistant:

EStatusCode AbstractContentContext::DrawImage(double inX,double inY,const std::string& inImagePath,const ImageOptions& inOptions)
{
	double transformation[6] = {1,0,0,1,0,0};

	if(inOptions.transformationMethod == eMatrix)
	{
		for(int i=0;i<6;++i)
			transformation[i] = inOptions.matrix[i];
	}
	else if(inOptions.transformationMethod == eFit)
	{
		DoubleAndDoublePair imageDimensions = mDocumentContext->GetImageDimensions(inImagePath,inOptions.imageIndex,inOptions.pdfParsingOptions);

        double scaleX = 1;
        double scaleY = 1;
                    
        if(inOptions.fitPolicy == eAlways)
        {
            scaleX = inOptions.boundingBoxWidth / imageDimensions.first;
            scaleY = inOptions.boundingBoxHeight / imageDimensions.second;
                        

        }
        else if(imageDimensions.first > inOptions.boundingBoxWidth || imageDimensions.second > inOptions.boundingBoxHeight) // overflow
        {
            scaleX = imageDimensions.first > inOptions.boundingBoxWidth ? inOptions.boundingBoxWidth / imageDimensions.first : 1;
            scaleY = imageDimensions.second > inOptions.boundingBoxHeight ? inOptions.boundingBoxHeight / imageDimensions.second : 1;
        }
                    
        if(inOptions.fitProportional)
        {
            scaleX = std::min(scaleX,scaleY);
            scaleY = scaleX;
        }
                    
        transformation[0] = scaleX;
        transformation[3] = scaleY;
	}

	transformation[4]+=inX;
	transformation[5]+=inY;

    // registering the images at pdfwriter to allow optimization on image writes
    ObjectIDTypeAndBool result = mDocumentContext->RegisterImageForDrawing(inImagePath,inOptions.imageIndex);
    if(result.second)
    {
        // if first usage, write the image
        ScheduleImageWrite(inImagePath,inOptions.imageIndex,result.first,inOptions.pdfParsingOptions);
    }
    
    q();
    cm(transformation[0],transformation[1],transformation[2],transformation[3],transformation[4],transformation[5]);
    Do(GetResourcesDictionary()->AddFormXObjectMapping(result.first));
    Q();
	return GetCurrentStatusCode();

}